

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void do_flash_proc(Am_Object *cmd)

{
  ostream *this;
  void *this_00;
  Am_Object *cmd_local;
  
  this = std::operator<<((ostream *)&std::cout,
                         "*** Unable to flash in this version: inspector disabled ***");
  this_00 = (void *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_flash, (Am_Object cmd))
{
#ifdef DEBUG
  Am_Object command_to_flash = get_command_to_undo(cmd);
  Am_Object object_modified;
  if (command_to_flash.Valid()) {
    Am_Value object_modified_value;
    object_modified_value = command_to_flash.Peek(Am_OBJECT_MODIFIED);
    if (object_modified_value.type == Am_OBJECT) {
      object_modified = object_modified_value;
      Am_Flash(object_modified, std::cout);
    } else {
      // ** TEMP, handle longer lists also **
      object_modified = if_list_get_obj(object_modified_value, true);
      if (object_modified.Valid())
        Am_Flash(object_modified, std::cout);
    }
  }
#else
  std::cout << "*** Unable to flash in this version: inspector disabled ***"
            << std::endl
            << std::flush;
#endif
}